

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

string * __thiscall
pmx::ReadString_abi_cxx11_
          (string *__return_storage_ptr__,pmx *this,istream *stream,uint8_t encoding)

{
  pointer start;
  char *result;
  uint16_t *sourceStart;
  allocator local_4d;
  int size;
  vector<char,_std::allocator<char>_> buffer;
  
  std::istream::read((char *)this,(long)&size);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((long)size == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_4d);
  }
  else {
    std::vector<char,_std::allocator<char>_>::reserve(&buffer,(long)size);
    std::istream::read((char *)this,
                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    start = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start;
    if ((char)stream == '\0') {
      result = (char *)operator_new__((ulong)(uint)(size * 3));
      memset(result,0,(ulong)(uint)(size * 3));
      utf8::utf16to8<unsigned_short_const*,char*>
                ((unsigned_short *)start,(unsigned_short *)(start + (long)(size / 2) * 2),result);
      std::__cxx11::string::string((string *)__return_storage_ptr__,result,&local_4d);
      operator_delete__(result);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + size);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadString(std::istream *stream, uint8_t encoding)
	{
		int size;
		stream->read((char*) &size, sizeof(int));
		std::vector<char> buffer;
		if (size == 0)
		{
			return std::string("");
		}
		buffer.reserve(size);
		stream->read((char*) buffer.data(), size);
		if (encoding == 0)
		{
			// UTF16 to UTF8
			const uint16_t* sourceStart = (uint16_t*)buffer.data();
			const unsigned int targetSize = size * 3; // enough to encode
			char *targetStart = new char[targetSize];
            std::memset(targetStart, 0, targetSize * sizeof(char));
            
            utf8::utf16to8( sourceStart, sourceStart + size/2, targetStart );

			std::string result(targetStart);
            delete [] targetStart;
			return result;
		}
		else
		{
			// the name is already UTF8
			return std::string((const char*)buffer.data(), size);
		}
	}